

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O2

bool __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Generator::generate(Generator *this)

{
  MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *this_00;
  uint uVar1;
  Texture2DGradientTestCase *pTVar2;
  PtrData<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> data;
  Texture2D *this_01;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  deUint8 levelNdx;
  ulong uVar6;
  Texture2D *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined1 *local_d8;
  float afStack_d0 [2];
  undefined8 local_c8;
  undefined8 uStack_c0;
  Vec4 cScale;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  Vec4 gMax;
  Vec4 gMin;
  
  this_01 = (Texture2D *)operator_new(0x50);
  pTVar2 = this->m_testCase;
  tcu::Texture2D::Texture2D
            (this_01,&pTVar2->m_format,(pTVar2->m_dimensions).m_data[0],
             (pTVar2->m_dimensions).m_data[1]);
  fmtInfo.valueMin.m_data[0] = 0.0;
  fmtInfo.valueMin.m_data[1] = 0.0;
  this_00 = &this->m_tex;
  data._8_8_ = in_stack_ffffffffffffff10;
  data.ptr = in_stack_ffffffffffffff08;
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::assignData
            (&this_00->super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>,data);
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~UniqueBase
            ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&fmtInfo);
  pTVar2 = this->m_testCase;
  uVar4 = (pTVar2->m_dimensions).m_data[0];
  uVar1 = (pTVar2->m_dimensions).m_data[1];
  if ((int)uVar1 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar4 = 0x20;
  if (uVar1 != 0) {
    uVar4 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x1f;
  }
  uVar3 = (ulong)(0x20 - uVar4);
  tcu::getTextureFormatInfo(&fmtInfo,&pTVar2->m_format);
  tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
  tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
  lVar5 = 0;
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    local_c8 = 0;
    uStack_c0 = 0x3f80000000000000;
    tcu::operator*((tcu *)&gMax,(Vector<float,_4> *)&local_c8,&cScale);
    tcu::operator+((tcu *)&gMin,(Vector<float,_4> *)&gMax,&cBias);
    local_d8 = &DAT_3f8000003f800000;
    afStack_d0[0] = 1.0;
    afStack_d0[1] = 0.0;
    tcu::operator*((tcu *)&local_c8,(Vector<float,_4> *)&local_d8,&cScale);
    tcu::operator+((tcu *)&gMax,(Vector<float,_4> *)&local_c8,&cBias);
    tcu::Texture2D::allocLevel
              ((this_00->super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>).
               m_data.ptr,(int)uVar6);
    tcu::fillWithComponentGradients
              ((PixelBufferAccess *)
               ((long)(((this_00->
                        super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>).
                        m_data.ptr)->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar5),&gMin,&gMax);
    lVar5 = lVar5 + 0x28;
  }
  return true;
}

Assistant:

virtual bool generate (void)
	{
		m_tex = de::MovePtr<Texture2D>(new Texture2D(m_testCase->m_format,
													 m_testCase->m_dimensions[0],
													 m_testCase->m_dimensions[1]));

		const deUint8 numLevels = (deUint8) (1 + deLog2Floor32(de::max(m_testCase->m_dimensions[0],
																	   m_testCase->m_dimensions[1])));

		const TextureFormatInfo fmtInfo = getTextureFormatInfo(m_testCase->m_format);

		const Vec4 cBias  = fmtInfo.valueMin;
		const Vec4 cScale = fmtInfo.valueMax - fmtInfo.valueMin;

		for (deUint8 levelNdx = 0; levelNdx < numLevels; ++levelNdx)
		{
			const Vec4 gMin = Vec4(0.0f, 0.0f, 0.0f, 1.0f) * cScale + cBias;
			const Vec4 gMax = Vec4(1.0f, 1.0f, 1.0f, 0.0f) * cScale + cBias;

			m_tex->allocLevel(levelNdx);
			fillWithComponentGradients(m_tex->getLevel(levelNdx), gMin, gMax);
		}

		return true;
	}